

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorDisposer.cpp
# Opt level: O2

void __thiscall ApprovalTests::ComparatorDisposer::~ComparatorDisposer(ComparatorDisposer *this)

{
  __shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  if (this->isActive == true) {
    this_00 = &::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
               ::operator[](this->comparators,&this->ext_)->
               super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>;
    ::std::__shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&(this->previousComparator).
                        super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>
              );
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->previousComparator).
              super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&this->ext_);
  return;
}

Assistant:

ComparatorDisposer::~ComparatorDisposer()
    {
        if (isActive)
        {
            comparators[ext_] = previousComparator;
        }
    }